

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  __m128i *palVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  int iVar14;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  undefined8 *puVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar22;
  ulong uVar21;
  int local_768;
  long local_760;
  int local_758;
  int local_74c;
  ulong uStack_748;
  __m128i vH_1;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_5fc;
  int32_t score;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int32_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_568;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_508;
  int iStack_504;
  int iStack_4d4;
  int iStack_4d0;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int local_498;
  int iStack_494;
  int iStack_490;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  int local_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_sse41_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_sse41_128_32","profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_scan_profile_sse41_128_32","profile->s1Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_scan_profile_sse41_128_32","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_scan_profile_sse41_128_32","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_scan_profile_sse41_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_568 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar12 = (iVar1 + 3) / 4;
    pvVar4 = (profile->profile32).score;
    if (-open < ppVar3->min) {
      local_74c = open + -0x80000000;
    }
    else {
      local_74c = -0x80000000 - ppVar3->min;
    }
    uVar13 = local_74c + 1;
    iVar14 = 0x7ffffffe - ppVar3->max;
    vSaturationCheckMax[1] = CONCAT44(iVar14,iVar14);
    vSaturationCheckMin[0] = CONCAT44(iVar14,iVar14);
    vSegLenXgap[1] = (longlong)uVar13;
    result._4_4_ = -iVar12 * gap;
    result._0_4_ = uVar13;
    vSegLenXgap[0]._0_4_ = result._4_4_;
    vSegLenXgap[0]._4_4_ = result._4_4_;
    _segNum = (parasail_profile_t *)parasail_result_new();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4400401;
      ptr = parasail_memalign___m128i(0x10,(long)iVar12);
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar12);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar12);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar12);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.v[3] = 0;
        for (k = 0; k < iVar12; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            local_758 = -(gap * (h.v[2] * iVar12 + k)) - open;
            local_760 = (long)local_758;
            if (local_760 < -0x80000000) {
              local_758 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_758;
            local_760 = local_760 - open;
            if (local_760 < -0x80000000) {
              local_760 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_760;
          }
          ptr_02[h.v[3]][0] = e.m[1];
          ptr_02[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_768 = -(gap * (k + -1)) - open;
          if (local_768 < -0x80000000) {
            local_768 = -0x80000000;
          }
          ptr_00[k] = local_768;
        }
        vE[1]._0_4_ = -open;
        vE[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        k = iVar12;
        while (k = k + -1, -1 < k) {
          ptr_03[k][0] = CONCAT44(vE[1]._4_4_,(int)vE[1]);
          ptr_03[k][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          vE[1]._0_4_ = (int)vE[1] - gap;
          vE[1]._4_4_ = vE[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
        }
        vNegInfFront[1] = CONCAT44(uVar13,uVar13);
        vSaturationCheckMax[0] = CONCAT44(uVar13,uVar13);
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar21 = ptr_02[iVar12 + -1][0];
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          local_308 = (int)(*ptr_03)[0];
          iStack_304 = (int)((ulong)(*ptr_03)[0] >> 0x20);
          iStack_300 = (int)(*ptr_03)[1];
          vF[1] = CONCAT44(uVar13 - iStack_304,uVar13 - local_308);
          vHt[0] = (longlong)(uVar13 - iStack_300);
          k = 0;
          pvW = (__m128i *)(uVar21 << 0x20 | (ulong)(uint)ptr_00[s1Len]);
          vHp[0] = ptr_02[iVar12 + -1][1] << 0x20 | uVar21 >> 0x20;
          vH[1] = CONCAT44(uVar13,uVar13);
          vF[0] = CONCAT44(uVar13,uVar13);
          while( true ) {
            local_188 = (int)vH[1];
            iStack_184 = (int)((ulong)vH[1] >> 0x20);
            iStack_180 = (int)vF[0];
            local_498 = (int)vF[1];
            iStack_494 = (int)((ulong)vF[1] >> 0x20);
            iStack_490 = (int)vHt[0];
            if (iVar12 <= k) break;
            palVar5 = (__m128i *)ptr_02[k][0];
            lVar6 = ptr_02[k][1];
            lVar7 = ptr[k][0];
            lVar8 = ptr[k][1];
            puVar15 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar2 * iVar12) * 0x10);
            uVar9 = *puVar15;
            uVar10 = puVar15[1];
            local_318 = (int)lVar7;
            iStack_314 = (int)((ulong)lVar7 >> 0x20);
            iStack_310 = (int)lVar8;
            iStack_30c = (int)((ulong)lVar8 >> 0x20);
            local_318 = local_318 - gap;
            iStack_314 = iStack_314 - gap;
            iStack_310 = iStack_310 - gap;
            iStack_30c = iStack_30c - gap;
            local_338 = (int)palVar5;
            iStack_334 = (int)((ulong)palVar5 >> 0x20);
            iStack_330 = (int)lVar6;
            iStack_32c = (int)((ulong)lVar6 >> 0x20);
            local_338 = local_338 - open;
            iStack_334 = iStack_334 - open;
            iStack_330 = iStack_330 - open;
            iStack_32c = iStack_32c - open;
            uVar16 = (uint)(local_318 < local_338) * local_338 |
                     (uint)(local_318 >= local_338) * local_318;
            uVar17 = (uint)(iStack_314 < iStack_334) * iStack_334 |
                     (uint)(iStack_314 >= iStack_334) * iStack_314;
            uVar19 = (uint)(iStack_310 < iStack_330) * iStack_330 |
                     (uint)(iStack_310 >= iStack_330) * iStack_310;
            uVar22 = (uint)(iStack_30c < iStack_32c) * iStack_32c |
                     (uint)(iStack_30c >= iStack_32c) * iStack_30c;
            vHt[1] = CONCAT44(uVar17,uVar16);
            vE[0] = CONCAT44(uVar22,uVar19);
            local_478 = (int)pvW;
            iStack_474 = (int)((ulong)pvW >> 0x20);
            iStack_470 = (int)vHp[0];
            iStack_46c = (int)((ulong)vHp[0] >> 0x20);
            local_488 = (int)uVar9;
            iStack_484 = (int)((ulong)uVar9 >> 0x20);
            iStack_480 = (int)uVar10;
            iStack_47c = (int)((ulong)uVar10 >> 0x20);
            local_478 = local_478 + local_488;
            iStack_474 = iStack_474 + iStack_484;
            iStack_470 = iStack_470 + iStack_480;
            iStack_46c = iStack_46c + iStack_47c;
            lVar7 = ptr_03[k][0];
            local_4a8 = (int)lVar7;
            iStack_4a4 = (int)((ulong)lVar7 >> 0x20);
            iStack_4a0 = (int)ptr_03[k][1];
            local_498 = local_498 + local_4a8;
            iStack_494 = iStack_494 + iStack_4a4;
            iStack_490 = iStack_490 + iStack_4a0;
            vH[1] = CONCAT44((uint)(iStack_184 < iStack_494) * iStack_494 |
                             (uint)(iStack_184 >= iStack_494) * iStack_184,
                             (uint)(local_188 < local_498) * local_498 |
                             (uint)(local_188 >= local_498) * local_188);
            vF[0] = (longlong)
                    ((uint)(iStack_180 < iStack_490) * iStack_490 |
                    (uint)(iStack_180 >= iStack_490) * iStack_180);
            vF[1] = CONCAT44((uint)((int)uVar17 < iStack_474) * iStack_474 |
                             ((int)uVar17 >= iStack_474) * uVar17,
                             (uint)((int)uVar16 < local_478) * local_478 |
                             ((int)uVar16 >= local_478) * uVar16);
            vHt[0] = CONCAT44((uint)((int)uVar22 < iStack_46c) * iStack_46c |
                              ((int)uVar22 >= iStack_46c) * uVar22,
                              (uint)((int)uVar19 < iStack_470) * iStack_470 |
                              ((int)uVar19 >= iStack_470) * uVar19);
            ptr[k][0] = vHt[1];
            ptr[k][1] = vE[0];
            ptr_01[k][0] = vF[1];
            ptr_01[k][1] = vHt[0];
            k = k + 1;
            pvW = palVar5;
            vHp[0] = lVar6;
          }
          iVar2 = ptr_00[(long)s1Len + 1];
          local_4c8 = (int)(*ptr_03)[0];
          iStack_4c4 = (int)((ulong)(*ptr_03)[0] >> 0x20);
          iStack_4c0 = (int)(*ptr_03)[1];
          local_4c8 = iVar2 + local_4c8;
          iStack_4c4 = local_498 + iStack_4c4;
          iStack_4c0 = iStack_494 + iStack_4c0;
          uVar16 = (uint)(iStack_180 < iStack_4c0) * iStack_4c0 |
                   (uint)(iStack_180 >= iStack_4c0) * iStack_180;
          vH[1] = CONCAT44((uint)(iStack_184 < iStack_4c4) * iStack_4c4 |
                           (uint)(iStack_184 >= iStack_4c4) * iStack_184,
                           (uint)(local_188 < local_4c8) * local_4c8 |
                           (uint)(local_188 >= local_4c8) * local_188);
          k = 0;
          while( true ) {
            vF[0] = (longlong)uVar16;
            iStack_4d4 = (int)vH[1];
            iStack_4d0 = (int)((ulong)vH[1] >> 0x20);
            if (1 < k) break;
            iVar18 = iStack_4d4 + result._4_4_;
            iVar20 = iStack_4d0 + (int)vSegLenXgap[0];
            uVar16 = (uint)((int)uVar16 < iVar20) * iVar20 | ((int)uVar16 >= iVar20) * uVar16;
            vH[1] = CONCAT44((uint)(iStack_4d0 < iVar18) * iVar18 |
                             (uint)(iStack_4d0 >= iVar18) * iStack_4d0,
                             (iStack_4d4 < (int)(uint)result) * (uint)result |
                             (uint)(iStack_4d4 >= (int)(uint)result) * iStack_4d4);
            k = k + 1;
          }
          vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
          local_508 = (int)vSegLenXgap[1];
          iStack_504 = (int)((ulong)vSegLenXgap[1] >> 0x20);
          iStack_4d4 = iStack_4d4 + iStack_504;
          vH[1] = CONCAT44(iStack_4d4,local_508);
          vHp[1] = CONCAT44((uint)(local_498 < iStack_4d4) * iStack_4d4 |
                            (uint)(local_498 >= iStack_4d4) * local_498,
                            (uint)(iVar2 < local_508) * local_508 |
                            (uint)(iVar2 >= local_508) * iVar2);
          vH[0] = CONCAT44((iStack_490 < (int)uVar16) * uVar16 |
                           (uint)(iStack_490 >= (int)uVar16) * iStack_490,
                           (uint)(iStack_494 < iStack_4d0) * iStack_4d0 |
                           (uint)(iStack_494 >= iStack_4d0) * iStack_494);
          for (k = 0; k < iVar12; k = k + 1) {
            lVar6 = ptr_01[k][0];
            lVar7 = ptr_01[k][1];
            local_358 = (int)vH[1];
            iStack_354 = (int)((ulong)vH[1] >> 0x20);
            iStack_350 = (int)vF[0];
            iStack_34c = (int)((ulong)vF[0] >> 0x20);
            local_358 = local_358 - gap;
            iStack_354 = iStack_354 - gap;
            iStack_350 = iStack_350 - gap;
            iStack_34c = iStack_34c - gap;
            local_378 = (int)vHp[1];
            iStack_374 = (int)((ulong)vHp[1] >> 0x20);
            iStack_370 = (int)vH[0];
            iStack_36c = (int)((ulong)vH[0] >> 0x20);
            local_378 = local_378 - open;
            iStack_374 = iStack_374 - open;
            iStack_370 = iStack_370 - open;
            iStack_36c = iStack_36c - open;
            uVar16 = (uint)(local_358 < local_378) * local_378 |
                     (uint)(local_358 >= local_378) * local_358;
            uVar17 = (uint)(iStack_354 < iStack_374) * iStack_374 |
                     (uint)(iStack_354 >= iStack_374) * iStack_354;
            uVar19 = (uint)(iStack_350 < iStack_370) * iStack_370 |
                     (uint)(iStack_350 >= iStack_370) * iStack_350;
            uVar22 = (uint)(iStack_34c < iStack_36c) * iStack_36c |
                     (uint)(iStack_34c >= iStack_36c) * iStack_34c;
            vH[1] = CONCAT44(uVar17,uVar16);
            vF[0] = CONCAT44(uVar22,uVar19);
            local_248 = (int)lVar6;
            iStack_244 = (int)((ulong)lVar6 >> 0x20);
            iStack_240 = (int)lVar7;
            iStack_23c = (int)((ulong)lVar7 >> 0x20);
            uVar16 = (local_248 < (int)uVar16) * uVar16 |
                     (uint)(local_248 >= (int)uVar16) * local_248;
            uVar17 = (iStack_244 < (int)uVar17) * uVar17 |
                     (uint)(iStack_244 >= (int)uVar17) * iStack_244;
            uVar19 = (iStack_240 < (int)uVar19) * uVar19 |
                     (uint)(iStack_240 >= (int)uVar19) * iStack_240;
            uVar22 = (iStack_23c < (int)uVar22) * uVar22 |
                     (uint)(iStack_23c >= (int)uVar22) * iStack_23c;
            vHp[1] = CONCAT44(uVar17,uVar16);
            vH[0] = CONCAT44(uVar22,uVar19);
            ptr_02[k][0] = vHp[1];
            ptr_02[k][1] = vH[0];
            local_148 = (int)vSaturationCheckMax[1];
            iStack_144 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_140 = (int)vSaturationCheckMin[0];
            iStack_13c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            vSaturationCheckMax[1] =
                 CONCAT44(((int)uVar17 < iStack_144) * uVar17 |
                          (uint)((int)uVar17 >= iStack_144) * iStack_144,
                          ((int)uVar16 < local_148) * uVar16 |
                          (uint)((int)uVar16 >= local_148) * local_148);
            vSaturationCheckMin[0] =
                 CONCAT44(((int)uVar22 < iStack_13c) * uVar22 |
                          (uint)((int)uVar22 >= iStack_13c) * iStack_13c,
                          ((int)uVar19 < iStack_140) * uVar19 |
                          (uint)((int)uVar19 >= iStack_140) * iStack_140);
            local_268 = (int)vNegInfFront[1];
            iStack_264 = (int)((ulong)vNegInfFront[1] >> 0x20);
            iStack_260 = (int)vSaturationCheckMax[0];
            iStack_25c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            vNegInfFront[1] =
                 CONCAT44((iStack_264 < (int)uVar17) * uVar17 |
                          (uint)(iStack_264 >= (int)uVar17) * iStack_264,
                          (local_268 < (int)uVar16) * uVar16 |
                          (uint)(local_268 >= (int)uVar16) * local_268);
            vSaturationCheckMax[0] =
                 CONCAT44((iStack_25c < (int)uVar22) * uVar22 |
                          (uint)(iStack_25c >= (int)uVar22) * iStack_25c,
                          (iStack_260 < (int)uVar19) * uVar19 |
                          (uint)(iStack_260 >= (int)uVar19) * iStack_260);
          }
        }
        vH_1[0] = ptr_02[(iVar1 + -1) % iVar12][1];
        uStack_748 = ptr_02[(iVar1 + -1) % iVar12][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar12) + 4U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x20 | uStack_748 >> 0x20;
          uStack_748 = uStack_748 << 0x20;
        }
        local_5fc = vH_1[0]._4_4_;
        local_e8 = (int)vSaturationCheckMax[1];
        iStack_e4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_e0 = (int)vSaturationCheckMin[0];
        iStack_dc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_b8 = (int)vNegInfFront[1];
        iStack_b4 = (int)((ulong)vNegInfFront[1] >> 0x20);
        iStack_b0 = (int)vSaturationCheckMax[0];
        iStack_ac = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar21 = CONCAT44(-(uint)(iStack_dc < (int)uVar13),-(uint)(iStack_e0 < (int)uVar13)) |
                 CONCAT44(-(uint)(iVar14 < iStack_ac),-(uint)(iVar14 < iStack_b0));
        auVar11._8_8_ = uVar21;
        auVar11._0_8_ =
             CONCAT44(-(uint)(iStack_e4 < (int)uVar13),-(uint)(local_e8 < (int)uVar13)) |
             CONCAT44(-(uint)(iVar14 < iStack_b4),-(uint)(iVar14 < local_b8));
        if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar21 >> 7 & 1) != 0) || (uVar21 >> 0xf & 1) != 0) || (uVar21 >> 0x17 & 1) != 0)
               || (uVar21 >> 0x1f & 1) != 0) || (uVar21 >> 0x27 & 1) != 0) ||
             (uVar21 >> 0x2f & 1) != 0) || (uVar21 >> 0x37 & 1) != 0) || (long)uVar21 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_5fc = 0;
          local_568 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = local_5fc;
        *(int *)((long)&_segNum->s1 + 4) = local_568;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}